

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.h
# Opt level: O1

Error asmjit::x86::FuncInternal::initCallConv(CallConv *cc,uint32_t ccId,Environment *environment)

{
  bool bVar1;
  bool bVar2;
  undefined4 uVar3;
  uint uVar4;
  uint8_t uVar5;
  uint uVar6;
  bool bVar7;
  bool bVar8;
  long lStack_8;
  
  bVar7 = environment->_platform == '\x01';
  bVar8 = environment->_abi == '\x01';
  cc->_arch = environment->_arch;
  cc->_saveRestoreRegSize[1] = '\x10';
  cc->_saveRestoreRegSize[2] = '\b';
  cc->_saveRestoreRegSize[3] = '\b';
  cc->_saveRestoreAlignment[1] = '\x10';
  cc->_saveRestoreAlignment[2] = '\b';
  cc->_saveRestoreAlignment[3] = '\b';
  if ((environment->_arch & 1) == 0) {
    cc->_saveRestoreRegSize[0] = '\b';
    cc->_saveRestoreAlignment[0] = '\b';
    uVar4 = (bVar8 || bVar7) | 0x20;
    uVar6 = ccId;
    if ((ccId & 0xfffffffb) - 1 < 3) {
      uVar6 = uVar4;
    }
    if (ccId == 8) {
      uVar6 = uVar4;
    }
    if (uVar6 - 0x10 < 3) {
      cc->_flags = 4;
      cc->_naturalStackAlignment = '\x10';
      *(undefined8 *)cc->_passedOrder = 0xffffff0706010200;
      *(undefined8 *)((long)cc->_passedOrder + 8) = 0xffffffffffffffff;
      *(undefined8 *)(cc->_passedOrder + 2) = 0x706050403020100;
      *(undefined8 *)((long)cc->_passedOrder + 0x28) = 0xffffffffffffffff;
      *(undefined8 *)(cc->_passedOrder + 1) = 0x706050403020100;
      *(undefined8 *)((long)cc->_passedOrder + 0x18) = 0xffffffffffffffff;
      *(undefined8 *)(cc->_passedOrder + 3) = 0x706050403020100;
      *(undefined8 *)((long)cc->_passedOrder + 0x38) = 0xffffffffffffffff;
      cc->_passedRegs[0] = 199;
      cc->_passedRegs[1] = 0xff;
      cc->_passedRegs[2] = 0xff;
      cc->_passedRegs[3] = 0xff;
      cc->_preservedRegs[0] = 0xffff;
      uVar3 = (undefined4)(-1L << ((char)uVar6 - 0xeU & 0x3f));
LAB_001319e4:
      uVar5 = (uint8_t)uVar6;
      lStack_8 = 0x24;
    }
    else {
      if (uVar6 == 4) {
        cc->_strategy = '\x02';
        cc->_spillZoneSize = '0';
        cc->_naturalStackAlignment = '\x10';
        cc->_flags = 0x14;
        *(undefined8 *)cc->_passedOrder = 0xffffffff09080201;
        *(undefined8 *)((long)cc->_passedOrder + 8) = 0xffffffffffffffff;
        cc->_passedRegs[0] = 0x306;
        cc->_passedRegs[1] = 0x3f;
        *(undefined8 *)(cc->_passedOrder + 1) = 0xffff050403020100;
        *(undefined8 *)((long)cc->_passedOrder + 0x18) = 0xffffffffffffffff;
        cc->_preservedRegs[0] = 0xf0f8;
        uVar6 = 4;
LAB_001319de:
        uVar3 = 0xffc0;
        goto LAB_001319e4;
      }
      if (uVar6 == 0x21) {
        cc->_strategy = '\x01';
        cc->_spillZoneSize = ' ';
        cc->_naturalStackAlignment = '\x10';
        cc->_flags = 0x96;
        *(undefined8 *)cc->_passedOrder = 0xffffffff09080201;
        *(undefined8 *)((long)cc->_passedOrder + 8) = 0xffffffffffffffff;
        cc->_passedRegs[0] = 0x306;
        cc->_passedRegs[1] = 0xf;
        *(undefined8 *)(cc->_passedOrder + 1) = 0xffffffff03020100;
        *(undefined8 *)((long)cc->_passedOrder + 0x18) = 0xffffffffffffffff;
        cc->_preservedRegs[0] = 0xf0f8;
        uVar6 = 0x21;
        goto LAB_001319de;
      }
      if (uVar6 != 0x20) {
        return 2;
      }
      cc->_flags = 0xa4;
      cc->_naturalStackAlignment = '\x10';
      cc->_redZoneSize = 0x80;
      *(undefined8 *)cc->_passedOrder = 0xffff090801020607;
      *(undefined8 *)((long)cc->_passedOrder + 8) = 0xffffffffffffffff;
      cc->_passedRegs[0] = 0x3c6;
      cc->_passedRegs[1] = 0xff;
      *(undefined8 *)(cc->_passedOrder + 1) = 0x706050403020100;
      *(undefined8 *)((long)cc->_passedOrder + 0x18) = 0xffffffffffffffff;
      uVar5 = ' ';
      uVar3 = 0xf038;
      lStack_8 = 0x20;
    }
    *(undefined4 *)(cc->_saveRestoreRegSize + lStack_8 + -8) = uVar3;
    goto LAB_00131ae7;
  }
  cc->_saveRestoreRegSize[0] = '\x04';
  cc->_saveRestoreAlignment[0] = '\x04';
  cc->_preservedRegs[0] = 0xf8;
  cc->_naturalStackAlignment = '\x04';
  bVar2 = false;
  bVar1 = true;
  switch(ccId) {
  case 1:
    break;
  case 2:
    ccId = 2;
    cc->_flags = 1;
    break;
  case 3:
    cc->_flags = 1;
    *(undefined8 *)cc->_passedOrder = 0xffffffffffff0201;
    *(undefined8 *)((long)cc->_passedOrder + 8) = 0xffffffffffffffff;
    cc->_passedRegs[0] = 6;
    ccId = 3;
    break;
  case 4:
    cc->_flags = 1;
    *(undefined8 *)cc->_passedOrder = 0xffffffffffff0201;
    *(undefined8 *)((long)cc->_passedOrder + 8) = 0xffffffffffffffff;
    cc->_passedRegs[0] = 6;
    cc->_passedRegs[1] = 0x3f;
    *(undefined8 *)(cc->_passedOrder + 1) = 0xffff050403020100;
    *(undefined8 *)((long)cc->_passedOrder + 0x18) = 0xffffffffffffffff;
    ccId = 4;
    break;
  case 5:
    if (bVar8 || bVar7) {
      cc->_flags = 1;
      *(undefined8 *)cc->_passedOrder = 0xffffffffffffff01;
      *(undefined8 *)((long)cc->_passedOrder + 8) = 0xffffffffffffffff;
      cc->_passedRegs[0] = 2;
      ccId = 5;
    }
    else {
      ccId = 1;
    }
    break;
  case 6:
    *(undefined8 *)cc->_passedOrder = 0xffffffffffffff00;
    *(undefined8 *)((long)cc->_passedOrder + 8) = 0xffffffffffffffff;
    cc->_passedRegs[0] = 1;
    ccId = 6;
    break;
  case 7:
    *(undefined8 *)cc->_passedOrder = 0xffffffffffff0200;
    *(undefined8 *)((long)cc->_passedOrder + 8) = 0xffffffffffffffff;
    cc->_passedRegs[0] = 5;
    ccId = 7;
    break;
  case 8:
    *(undefined8 *)cc->_passedOrder = 0xffffffffff010200;
    *(undefined8 *)((long)cc->_passedOrder + 8) = 0xffffffffffffffff;
    cc->_passedRegs[0] = 7;
    ccId = 8;
    break;
  default:
    goto switchD_001318d4_caseD_9;
  case 0x10:
  case 0x11:
  case 0x12:
    cc->_flags = 4;
    *(undefined8 *)cc->_passedOrder = 0xffffff0706010200;
    *(undefined8 *)((long)cc->_passedOrder + 8) = 0xffffffffffffffff;
    *(undefined8 *)(cc->_passedOrder + 2) = 0x706050403020100;
    *(undefined8 *)((long)cc->_passedOrder + 0x28) = 0xffffffffffffffff;
    *(undefined8 *)(cc->_passedOrder + 1) = 0x706050403020100;
    *(undefined8 *)((long)cc->_passedOrder + 0x18) = 0xffffffffffffffff;
    *(undefined8 *)(cc->_passedOrder + 3) = 0x706050403020100;
    *(undefined8 *)((long)cc->_passedOrder + 0x38) = 0xffffffffffffffff;
    cc->_passedRegs[0] = 199;
    cc->_passedRegs[1] = 0xff;
    cc->_passedRegs[2] = 0xff;
    cc->_passedRegs[3] = 0xff;
    cc->_preservedRegs[0] = 0xff;
    cc->_preservedRegs[1] = (uint)(-1L << ((char)ccId - 0xeU & 0x3f)) & 0xff;
    cc->_naturalStackAlignment = '\x10';
    bVar1 = false;
  }
  if (bVar1) {
    *(undefined8 *)(cc->_passedOrder + 2) = 0xffffffffff020100;
    *(undefined8 *)((long)cc->_passedOrder + 0x28) = 0xffffffffffffffff;
    *(undefined8 *)(cc->_passedOrder + 1) = 0xffffffffff020100;
    *(undefined8 *)((long)cc->_passedOrder + 0x18) = 0xffffffffffffffff;
    cc->_passedRegs[1] = 7;
    cc->_passedRegs[2] = 7;
    *(byte *)&cc->_flags = (byte)cc->_flags | 8;
  }
  bVar2 = true;
  if (ccId == 1) {
    *(byte *)&cc->_flags = (byte)cc->_flags | 0x80;
  }
switchD_001318d4_caseD_9:
  uVar5 = (uint8_t)ccId;
  if (!bVar2) {
    return 2;
  }
LAB_00131ae7:
  cc->_id = uVar5;
  return 0;
}

Assistant:

inline bool isPlatformWindows() const noexcept { return _platform == kPlatformWindows; }